

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O3

void text_search_list(t_text_search *x,t_symbol *s,int argc,t_atom *argv)

{
  float fVar1;
  uint uVar2;
  t_key_conflict *ptVar3;
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  t_atomtype tVar9;
  _binbuf *x_00;
  t_atom *ptVar10;
  word *pwVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  t_atom *ptVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  bool bVar27;
  bool bVar28;
  float fVar29;
  t_float f;
  float fVar32;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int local_8c;
  
  x_00 = text_client_getbuf(&x->x_tc);
  if (x_00 == (_binbuf *)0x0) {
    return;
  }
  uVar2 = x->x_nkeys;
  if (argc < (int)uVar2) {
    pd_error(x,"need %d keys, only got %d in list",(ulong)uVar2,(ulong)(uint)argc);
  }
  ptVar10 = binbuf_getvec(x_00);
  uVar8 = binbuf_getnatom(x_00);
  if ((int)uVar2 < 1) {
    bug("text_search");
  }
  if ((int)uVar8 < 1) {
    f = -1.0;
  }
  else {
    local_8c = -1;
    uVar25 = 0;
    iVar22 = 0;
    uVar19 = 0xffffffff;
    bVar7 = false;
    uVar16 = 0;
    do {
      uVar14 = (uint)uVar16;
      if (uVar25 == uVar8 - 1 || (ptVar10[uVar25].a_type & ~A_FLOAT) == A_SEMI) {
        uVar20 = uVar19;
        iVar5 = local_8c;
        if (x->x_onset <= iVar22) {
          if (x->x_onset + x->x_range <= iVar22) break;
          uVar15 = (uint)uVar19;
          if (argc < 1) {
            if (local_8c < 0) {
              local_8c = iVar22;
              uVar15 = uVar14;
            }
            uVar20 = (ulong)uVar15;
            iVar5 = local_8c;
          }
          else {
            iVar26 = (int)uVar25 - uVar14;
            ptVar3 = x->x_keyvec;
            iVar12 = ptVar3->k_field;
            iVar24 = ptVar3->k_binop;
            pwVar11 = &argv->a_w;
            uVar13 = 1;
            iVar21 = iVar12;
            iVar18 = iVar24;
            do {
              if (iVar26 <= iVar21) goto LAB_0018d339;
              iVar23 = iVar21 + uVar14;
              if (ptVar10[iVar23].a_type != ((t_atom *)(pwVar11 + -1))->a_type) goto LAB_0018d339;
              if ((float)ptVar10[iVar23].a_type != 1.4013e-45) {
                if (iVar18 == 0) {
                  if (ptVar10[iVar23].a_w.w_symbol == pwVar11->w_symbol)
                  goto switchD_0018d23f_default;
                }
                else {
                  bVar28 = !bVar7;
                  bVar7 = true;
                  if (bVar28) {
                    pd_error(x,"text search (%s): only exact matches allowed for symbols",
                             pwVar11->w_symbol->s_name);
                  }
                }
                goto LAB_0018d339;
              }
              switch(iVar18) {
              case 0:
                if ((ptVar10[iVar23].a_w.w_float != pwVar11->w_float) ||
                   (NAN(ptVar10[iVar23].a_w.w_float) || NAN(pwVar11->w_float))) goto LAB_0018d339;
                break;
              case 1:
                bVar28 = pwVar11->w_float < ptVar10[iVar23].a_w.w_float;
                goto LAB_0018d2a3;
              case 2:
                bVar28 = pwVar11->w_float == ptVar10[iVar23].a_w.w_float;
                bVar27 = pwVar11->w_float < ptVar10[iVar23].a_w.w_float;
                goto LAB_0018d285;
              case 3:
                bVar28 = ptVar10[iVar23].a_w.w_float < pwVar11->w_float;
LAB_0018d2a3:
                if (!bVar28) goto LAB_0018d339;
                break;
              case 4:
                bVar28 = ptVar10[iVar23].a_w.w_float == pwVar11->w_float;
                bVar27 = ptVar10[iVar23].a_w.w_float < pwVar11->w_float;
LAB_0018d285:
                if (!bVar27 && !bVar28) goto LAB_0018d339;
              }
switchD_0018d23f_default:
              if ((long)uVar13 < (long)(int)uVar2) {
                iVar21 = ptVar3[uVar13].k_field;
                iVar18 = ptVar3[uVar13].k_binop;
              }
              else {
                iVar21 = iVar21 + 1;
              }
              pwVar11 = pwVar11 + 2;
              bVar28 = uVar13 != (uint)argc;
              uVar13 = uVar13 + 1;
            } while (bVar28);
            uVar6 = uVar15;
            if (-1 >= local_8c) {
              iVar5 = iVar22;
              uVar6 = uVar14;
            }
            if (-1 < local_8c && 0 < argc) {
              ptVar17 = argv;
              uVar13 = 1;
              do {
                if ((iVar26 <= iVar12) ||
                   (tVar9 = ptVar10[(int)(iVar12 + uVar14)].a_type, tVar9 != ptVar17->a_type)) {
                  bug("text search 2");
                  tVar9 = ptVar17->a_type;
                }
                if (tVar9 == A_FLOAT) {
                  auVar31._0_12_ = ZEXT812(0xe0ad78ec);
                  auVar31._12_4_ = 0;
                  if (-1 < (int)uVar15) {
                    auVar31 = ZEXT416((uint)ptVar10[(int)(iVar12 + uVar15)].a_w.w_index);
                  }
                  fVar32 = ptVar10[(int)(iVar12 + uVar14)].a_w.w_float;
                  fVar29 = auVar31._0_4_;
                  uVar20 = uVar16;
                  if (iVar24 - 1U < 2) {
LAB_0018d492:
                    iVar5 = iVar22;
                    if ((fVar32 < fVar29) || (uVar20 = uVar19, iVar5 = local_8c, fVar29 < fVar32))
                    break;
                  }
                  else {
                    if (1 < iVar24 - 3U) {
                      if (iVar24 != 5) goto LAB_0018d49c;
                      fVar1 = (ptVar17->a_w).w_float;
                      if ((fVar1 <= fVar32) && (fVar1 <= fVar29)) goto LAB_0018d492;
                      if ((fVar1 < fVar32) || (fVar1 < fVar29)) {
                        auVar30._0_8_ = CONCAT44(fVar29 - fVar1,fVar32 - fVar1) ^ 0x8000000080000000
                        ;
                        auVar30._8_4_ = -(0.0 - fVar1);
                        auVar30._12_4_ = -(0.0 - fVar1);
                        auVar4._4_4_ = fVar29 - fVar1;
                        auVar4._0_4_ = fVar32 - fVar1;
                        auVar4._8_4_ = 0.0 - fVar1;
                        auVar4._12_4_ = 0.0 - fVar1;
                        auVar31 = maxps(auVar30,auVar4);
                        fVar32 = auVar31._4_4_;
                      }
                    }
                    iVar5 = iVar22;
                    if ((auVar31._0_4_ < fVar32) ||
                       (uVar20 = uVar19, iVar5 = local_8c, fVar32 < auVar31._0_4_)) break;
                  }
                }
LAB_0018d49c:
                if ((long)uVar13 < (long)(int)uVar2) {
                  iVar12 = x->x_keyvec[uVar13].k_field;
                  iVar24 = x->x_keyvec[uVar13].k_binop;
                }
                else {
                  iVar12 = iVar12 + 1;
                }
                ptVar17 = ptVar17 + 1;
                bVar28 = uVar13 != (uint)argc;
                uVar20 = uVar19;
                uVar13 = uVar13 + 1;
                iVar5 = local_8c;
              } while (bVar28);
            }
            else {
              uVar20 = (ulong)uVar6;
            }
          }
        }
LAB_0018d339:
        local_8c = iVar5;
        iVar22 = iVar22 + 1;
        uVar16 = uVar25 + 1 & 0xffffffff;
        uVar19 = uVar20;
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar8);
    f = (t_float)local_8c;
  }
  outlet_float(x->x_out1,f);
  return;
}

Assistant:

static void text_search_list(t_text_search *x,
    t_symbol *s, int argc, t_atom *argv)
{
    t_binbuf *b = text_client_getbuf(&x->x_tc);
    int i, n, lineno, bestline = -1, beststart=-1, bestn, thisstart,
        nkeys = x->x_nkeys, failed = 0;
    t_atom *vec;
    if (!b)
       return;
    if (argc < nkeys)
    {
        pd_error(x, "need %d keys, only got %d in list",
            nkeys, argc);
    }
    vec = binbuf_getvec(b);
    n = binbuf_getnatom(b);
    if (nkeys < 1)
        bug("text_search");
    for (i = lineno = thisstart = 0; i < n; i++)
    {
        if (vec[i].a_type == A_SEMI || vec[i].a_type == A_COMMA || i == n-1)
        {
            int thisn, j, field, binop;
            if (lineno < x->x_onset)
                goto nomatch;
            if (lineno >= x->x_onset + x->x_range)
                break;
            thisn = i - thisstart;
            field = x->x_keyvec[0].k_field;
            binop = x->x_keyvec[0].k_binop;
                /* do we match? */
            for (j = 0; j < argc; )
            {
                if (field >= thisn ||
                    vec[thisstart+field].a_type != argv[j].a_type)
                        goto nomatch;
                if (argv[j].a_type == A_FLOAT)      /* arg is a float */
                {
                    switch (binop)
                    {
                        case KB_EQ:
                            if (vec[thisstart+field].a_w.w_float !=
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_GT:
                            if (vec[thisstart+field].a_w.w_float <=
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_GE:
                            if (vec[thisstart+field].a_w.w_float <
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_LT:
                            if (vec[thisstart+field].a_w.w_float >=
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                        case KB_LE:
                            if (vec[thisstart+field].a_w.w_float >
                                argv[j].a_w.w_float)
                                    goto nomatch;
                        break;
                            /* the other possibility ('near') never fails */
                    }
                }
                else                                /* arg is a symbol */
                {
                    if (binop != KB_EQ)
                    {
                        if (!failed)
                        {
                            pd_error(x,
                    "text search (%s): only exact matches allowed for symbols",
                                argv[j].a_w.w_symbol->s_name);
                            failed = 1;
                        }
                        goto nomatch;
                    }
                    if (vec[thisstart+field].a_w.w_symbol !=
                        argv[j].a_w.w_symbol)
                            goto nomatch;
                }
                if (++j >= nkeys)    /* if at last key just increment field */
                    field++;
                else field = x->x_keyvec[j].k_field,    /* else next key */
                        binop = x->x_keyvec[j].k_binop;
            }
                /* the line matches.  Now, if there is a previous match, are
                we better than it? */
            if (bestline >= 0)
            {
                field = x->x_keyvec[0].k_field;
                binop = x->x_keyvec[0].k_binop;
                for (j = 0; j < argc; )
                {
                    if (field >= thisn
                        || vec[thisstart+field].a_type != argv[j].a_type)
                            bug("text search 2");
                    if (argv[j].a_type == A_FLOAT)      /* arg is a float */
                    {
                        float thisv = vec[thisstart+field].a_w.w_float,
                            bestv = (beststart >= 0 ?
                                vec[beststart+field].a_w.w_float : -1e20);
                        switch (binop)
                        {
                            case KB_GT:
                            case KB_GE:
                                if (thisv < bestv)
                                    goto replace;
                                else if (thisv > bestv)
                                    goto nomatch;
                            break;
                            case KB_LT:
                            case KB_LE:
                                if (thisv > bestv)
                                    goto replace;
                                else if (thisv < bestv)
                                    goto nomatch;
                            break;
                            case KB_NEAR:
                                if (thisv >= argv[j].a_w.w_float &&
                                    bestv >= argv[j].a_w.w_float)
                                {
                                    if (thisv < bestv)
                                        goto replace;
                                    else if (thisv > bestv)
                                        goto nomatch;
                                }
                                else if (thisv <= argv[j].a_w.w_float &&
                                    bestv <= argv[j].a_w.w_float)
                                {
                                    if (thisv > bestv)
                                        goto replace;
                                    else if (thisv < bestv)
                                        goto nomatch;
                                }
                                else
                                {
                                    float d1 = thisv - argv[j].a_w.w_float,
                                        d2 = bestv - argv[j].a_w.w_float;
                                    if (d1 < 0)
                                        d1 = -d1;
                                    if (d2 < 0)
                                        d2 = -d2;

                                    if (d1 < d2)
                                        goto replace;
                                    else if (d1 > d2)
                                        goto nomatch;
                                }
                            break;
                                /* the other possibility ('=') never decides */
                        }
                    }
                    if (++j >= nkeys)    /* last key - increment field */
                        field++;
                    else field = x->x_keyvec[j].k_field,    /* else next key */
                            binop = x->x_keyvec[j].k_binop;
                }
                goto nomatch;   /* a tie - keep the old one */
            replace:
                bestline = lineno, beststart = thisstart, bestn = thisn;
            }
                /* no previous match so we're best */
            else bestline = lineno, beststart = thisstart, bestn = thisn;
        nomatch:
            lineno++;
            thisstart = i+1;
        }
    }
    outlet_float(x->x_out1, bestline);
}